

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O3

void __thiscall
dgrminer::PartialUnion::removeInfrequentEdges
          (PartialUnion *this,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *newedges,
          set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
          *edges_set,int support_as_absolute,bool set_of_graphs,bool debugPrint)

{
  pointer paVar1;
  array<int,_8UL> *paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 *puVar6;
  bool bVar7;
  long lVar8;
  pointer paVar9;
  long lVar10;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  _Var11;
  pointer paVar12;
  undefined4 **ppuVar13;
  __normal_iterator<std::array<int,_8UL>_*,_std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  _Var14;
  int count;
  undefined1 local_1c0 [24];
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  undefined4 *local_198;
  undefined8 uStack_190;
  PartialUnion *local_188;
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *local_180;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *local_178;
  undefined1 local_170 [16];
  _Base_ptr p_Stack_160;
  _Base_ptr local_158;
  undefined4 *local_150;
  undefined8 uStack_148;
  PartialUnion *local_140;
  undefined4 local_134;
  undefined1 local_130 [24];
  _Base_ptr p_Stack_118;
  _Base_ptr local_110;
  undefined4 *local_108;
  undefined8 uStack_100;
  PartialUnion *local_f8;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *local_f0;
  _Rb_tree_color local_e8;
  _Base_ptr local_e0 [3];
  undefined4 *local_c8;
  undefined8 uStack_c0;
  PartialUnion *local_b8;
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  local_b0;
  int local_80;
  undefined4 uStack_7c;
  PartialUnion *pPStack_78;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  *local_70;
  _Rb_tree_color local_68;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_60;
  undefined4 *local_48;
  undefined1 uStack_40;
  undefined7 uStack_3f;
  PartialUnion *local_38;
  
  local_134 = 0;
  paVar12 = (this->edges).
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  paVar1 = (this->edges).
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_180 = &edges_set->_M_t;
  local_70 = edges_set;
  local_68 = support_as_absolute;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_60,newedges);
  local_170._0_4_ = local_68;
  local_178 = local_70;
  local_48 = &local_134;
  uStack_40 = set_of_graphs;
  local_38 = this;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)(local_170 + 8)
             ,&local_60);
  local_110 = local_158;
  p_Stack_118 = p_Stack_160;
  local_130._16_8_ = local_170._8_8_;
  local_140 = local_38;
  uStack_148 = CONCAT71(uStack_3f,uStack_40);
  local_150 = local_48;
  local_170._8_8_ = (_Base_ptr)0x0;
  p_Stack_160 = (_Base_ptr)0x0;
  local_158 = (_Base_ptr)0x0;
  local_130._8_4_ = local_170._0_4_;
  local_130._0_8_ = local_178;
  uStack_100 = CONCAT71(uStack_3f,uStack_40);
  local_108 = local_48;
  local_f8 = local_38;
  _Var11._M_current = (array<int,_8UL> *)local_e0;
  local_e8 = local_170._0_4_;
  local_f0 = local_178;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             _Var11._M_current,
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_130 + 0x10));
  local_b8 = local_f8;
  local_c8 = local_108;
  uStack_c0 = uStack_100;
  local_1c0._8_4_ = local_e8;
  local_1c0._0_8_ = local_f0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_1c0 + 0x10),
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             _Var11._M_current);
  local_188 = local_b8;
  local_198 = local_c8;
  uStack_190 = uStack_c0;
  lVar10 = (long)paVar1 - (long)paVar12;
  if (0 < lVar10 >> 7) {
    lVar8 = (lVar10 >> 7) + 1;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_1c0,_Var11);
      paVar9 = paVar12;
      if (bVar7) goto LAB_0015f5bf;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_1c0,_Var11);
      if (bVar7) {
        paVar9 = paVar12 + 1;
        goto LAB_0015f5bf;
      }
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_1c0,_Var11);
      if (bVar7) {
        paVar9 = paVar12 + 2;
        goto LAB_0015f5bf;
      }
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_1c0,_Var11);
      if (bVar7) {
        paVar9 = paVar12 + 3;
        goto LAB_0015f5bf;
      }
      paVar12 = paVar12 + 4;
      lVar8 = lVar8 + -1;
      lVar10 = lVar10 + -0x80;
    } while (1 < lVar8);
  }
  lVar10 = lVar10 >> 5;
  if (lVar10 == 1) {
LAB_0015f59a:
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1c0,_Var11);
    paVar9 = paVar12;
    if (!bVar7) {
      paVar9 = paVar1;
    }
  }
  else if (lVar10 == 2) {
LAB_0015f588:
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                          *)local_1c0,_Var11);
    paVar9 = paVar12;
    if (!bVar7) {
      paVar12 = paVar12 + 1;
      goto LAB_0015f59a;
    }
  }
  else {
    paVar9 = paVar1;
    if ((lVar10 == 3) &&
       (bVar7 = __gnu_cxx::__ops::
                _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
                ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                              *)local_1c0,_Var11), paVar9 = paVar12, !bVar7)) {
      paVar12 = paVar12 + 1;
      goto LAB_0015f588;
    }
  }
LAB_0015f5bf:
  if ((_Base_ptr)local_1c0._16_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_1c0._16_8_);
  }
  if (local_e0[0] != (_Base_ptr)0x0) {
    operator_delete(local_e0[0]);
  }
  paVar12 = paVar9 + 1;
  if (paVar12 != paVar1 && paVar9 != paVar1) {
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_0>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__0>
                            *)local_130,_Var11);
      if (!bVar7) {
        uVar3 = *(undefined8 *)paVar12->_M_elems;
        uVar4 = *(undefined8 *)(paVar12->_M_elems + 2);
        uVar5 = *(undefined8 *)(paVar12->_M_elems + 6);
        *(undefined8 *)(paVar9->_M_elems + 4) = *(undefined8 *)(paVar12->_M_elems + 4);
        *(undefined8 *)(paVar9->_M_elems + 6) = uVar5;
        *(undefined8 *)paVar9->_M_elems = uVar3;
        *(undefined8 *)(paVar9->_M_elems + 2) = uVar4;
        paVar9 = paVar9 + 1;
      }
      paVar12 = paVar12 + 1;
    } while (paVar12 != paVar1);
  }
  if ((_Base_ptr)local_130._16_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_130._16_8_);
  }
  if ((_Base_ptr)local_170._8_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_170._8_8_);
  }
  if (paVar9 != (this->edges).
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    (this->edges).super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = paVar9;
  }
  if (local_60.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  _Var11._M_current =
       (newedges->super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (newedges->
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::_Rb_tree(&local_b0,local_180);
  uStack_7c = CONCAT31(uStack_7c._1_3_,set_of_graphs);
  local_80 = support_as_absolute;
  pPStack_78 = this;
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)&local_178,&local_b0);
  puVar6 = local_150;
  local_130._16_8_ = local_170._8_8_;
  uStack_148 = CONCAT44(uStack_7c,local_80);
  local_140 = pPStack_78;
  local_1a8 = (_Base_ptr)(local_1c0 + 8);
  ppuVar13 = &local_108;
  if ((_Base_ptr)local_170._8_8_ == (_Base_ptr)0x0) {
    local_1c0._8_4_ = _S_red;
    local_198 = (undefined4 *)0x0;
    p_Stack_118 = (_Base_ptr)(local_130 + 8);
    local_110 = p_Stack_118;
  }
  else {
    *(_Base_ptr *)(local_170._8_8_ + 8) = local_1a8;
    ppuVar13 = &local_198;
    local_198 = local_150;
    local_170._8_8_ = (_Base_ptr)0x0;
    local_150 = (undefined4 *)0x0;
    *(_Base_ptr *)(local_130._16_8_ + 8) = (_Base_ptr)(local_130 + 8);
    local_108 = puVar6;
    p_Stack_118 = p_Stack_160;
    local_110 = local_158;
    local_1c0._8_4_ = local_170._0_4_;
    p_Stack_160 = (_Base_ptr)local_170;
    local_158 = (_Base_ptr)local_170;
  }
  uStack_190 = CONCAT44(uStack_7c,local_80);
  local_188 = pPStack_78;
  local_1c0._16_8_ = (_Base_ptr)0x0;
  *ppuVar13 = (undefined4 *)0x0;
  uStack_100 = uStack_190;
  local_f8 = local_188;
  local_1a0 = local_1a8;
  local_130._8_4_ = local_1c0._8_4_;
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)local_1c0);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)&local_f0,
             (_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)local_130);
  uStack_c0 = uStack_100;
  local_b8 = local_f8;
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)local_1c0,
             (_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)&local_f0);
  uStack_190 = uStack_c0;
  local_188 = local_b8;
  lVar10 = (long)paVar2 - (long)_Var11._M_current;
  if (0 < lVar10 >> 7) {
    lVar8 = (lVar10 >> 7) + 1;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_1c0,_Var11);
      _Var14._M_current = _Var11._M_current;
      if (bVar7) goto LAB_0015f8a1;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_1c0,_Var11._M_current + 1);
      _Var14._M_current = _Var11._M_current + 1;
      if (bVar7) goto LAB_0015f8a1;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_1c0,_Var11._M_current + 2);
      _Var14._M_current = _Var11._M_current + 2;
      if (bVar7) goto LAB_0015f8a1;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_1c0,_Var11._M_current + 3);
      _Var14._M_current = _Var11._M_current + 3;
      if (bVar7) goto LAB_0015f8a1;
      _Var11._M_current = _Var11._M_current + 4;
      lVar8 = lVar8 + -1;
      lVar10 = lVar10 + -0x80;
    } while (1 < lVar8);
  }
  lVar10 = lVar10 >> 5;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      _Var14._M_current = paVar2;
      if ((lVar10 != 3) ||
         (bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
                  ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                                *)local_1c0,_Var11), _Var14._M_current = _Var11._M_current, bVar7))
      goto LAB_0015f8a1;
      _Var11._M_current = _Var11._M_current + 1;
    }
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
            ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                          *)local_1c0,_Var11);
    _Var14._M_current = _Var11._M_current;
    if (bVar7) goto LAB_0015f8a1;
    _Var11._M_current = _Var11._M_current + 1;
  }
  bVar7 = __gnu_cxx::__ops::
          _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
          ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                        *)local_1c0,_Var11);
  _Var14._M_current = _Var11._M_current;
  if (!bVar7) {
    _Var14._M_current = paVar2;
  }
LAB_0015f8a1:
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)local_1c0);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)&local_f0);
  _Var11._M_current = _Var14._M_current + 1;
  if (_Var11._M_current != paVar2 && _Var14._M_current != paVar2) {
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::$_1>
              ::operator()((_Iter_pred<dgrminer::PartialUnion::removeInfrequentEdges(std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>&,std::set<dgrminer::labeled_edge_with_occurrences,std::less<dgrminer::labeled_edge_with_occurrences>,std::allocator<dgrminer::labeled_edge_with_occurrences>>&,int,bool,bool)::__1>
                            *)local_130,_Var11);
      if (!bVar7) {
        uVar3 = *(undefined8 *)(_Var11._M_current)->_M_elems;
        uVar4 = *(undefined8 *)((_Var11._M_current)->_M_elems + 2);
        uVar5 = *(undefined8 *)((_Var11._M_current)->_M_elems + 6);
        *(undefined8 *)((_Var14._M_current)->_M_elems + 4) =
             *(undefined8 *)((_Var11._M_current)->_M_elems + 4);
        *(undefined8 *)((_Var14._M_current)->_M_elems + 6) = uVar5;
        *(undefined8 *)(_Var14._M_current)->_M_elems = uVar3;
        *(undefined8 *)((_Var14._M_current)->_M_elems + 2) = uVar4;
        _Var14._M_current = _Var14._M_current + 1;
      }
      _Var11._M_current = _Var11._M_current + 1;
    } while (_Var11._M_current != paVar2);
  }
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)local_130);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree((_Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
               *)&local_178);
  if (_Var14._M_current !=
      (newedges->super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    (newedges->super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = _Var14._M_current;
  }
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree(&local_b0);
  return;
}

Assistant:

void PartialUnion::removeInfrequentEdges(std::vector<std::array<int, 8>> & newedges, std::set<labeled_edge_with_occurrences> & edges_set,
		int support_as_absolute, bool set_of_graphs, bool debugPrint = false)
	{
		int count = 0;
		edges.erase(std::remove_if(std::begin(edges), std::end(edges), [&edges_set, support_as_absolute, newedges, &count, set_of_graphs, this](array<int, 8> edge) mutable {
			std::array<int, 8> ne = newedges[count];
			labeled_edge_with_occurrences le;
			le.elements = smallerDirectionOfAdjacencyInfo(ne);
			++count;

		  	std::set<labeled_edge_with_occurrences>::iterator it = edges_set.find(le);

			if (set_of_graphs)
			{
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = it->occurrences.begin(); it2 != it->occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(queryMappingSnapshotsToGraphs(*it2));
				}

				return (((!new_measures && mapped_occurrences.size() < support_as_absolute) || (new_measures && it->support(edges, true, heuristic_mis) < support_as_absolute))
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}
			else
			{
				// only change edges can be infrequent (i.e. any of their changetimes >= 0)
				return (it->support(edges, new_measures, heuristic_mis) < support_as_absolute
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}

		}), std::end(edges));


		newedges.erase(std::remove_if(std::begin(newedges), std::end(newedges), [edges_set, support_as_absolute, set_of_graphs, this](array<int, 8> edge) {
			labeled_edge_with_occurrences le;
			le.elements = smallerDirectionOfAdjacencyInfo(edge);

			auto it = edges_set.find(le);

			if (set_of_graphs)
			{
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = it->occurrences.begin(); it2 != it->occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(queryMappingSnapshotsToGraphs(*it2));
				}
				return (((!new_measures && mapped_occurrences.size() < support_as_absolute) || (new_measures && it->support(edges, true, heuristic_mis) < support_as_absolute))
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}
			else
			{
				return (it->support(edges, new_measures, heuristic_mis) < support_as_absolute
					&& (it->elements[ADJ_INFO_CHANGETIME] >= 0 || it->elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || it->elements[ADJ_INFO_DST_CHANGETIME] >= 0));
			}

		}), std::end(newedges));
	}